

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeXYZnode::ComputeQ
          (ChLoadXYZnodeXYZnode *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *pCVar1;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  Index index;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChVector<double> v;
  ChVector<double> nodeBpos_dt;
  ChVector<double> nodeBpos;
  ChVector<double> nodeApos_dt;
  ChVector<double> nodeApos;
  ChVector<double> v_1;
  double *local_108;
  double dStack_100;
  double local_f8;
  ChState *local_f0;
  undefined8 local_e8;
  long local_d8;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  double local_48;
  double dStack_40;
  double local_38;
  
  psVar3 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = (psVar3->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(peVar4,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo);
  }
  if (lVar5 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar5 = 0;
  }
  else {
    this_00 = (psVar3->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  psVar3 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = psVar3[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(peVar4,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo,0xffffffffffffffff);
  }
  if (lVar6 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar6 = 0;
  }
  else {
    this_01 = psVar3[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_88.m_data[2] = 0.0;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  if (state_x == (ChState *)0x0) {
    if ((ChVector<double> *)(lVar5 + 8) != &local_68) {
      local_68.m_data[0] = *(double *)(lVar5 + 8);
      local_68.m_data[1] = *(double *)(lVar5 + 0x10);
      local_68.m_data[2] = *(double *)(lVar5 + 0x18);
    }
    if ((ChVector<double> *)(lVar6 + 8) != &local_a8) {
      local_a8.m_data[0] = *(double *)(lVar6 + 8);
      local_a8.m_data[1] = *(double *)(lVar6 + 0x10);
      local_a8.m_data[2] = *(double *)(lVar6 + 0x18);
    }
  }
  else {
    local_108 = (state_x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_d8 = (state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    dStack_100 = 1.48219693752374e-323;
    local_e8 = 0;
    local_f0 = state_x;
    if (local_d8 < 3) goto LAB_005de2a4;
    ChVector<double>::operator=
              (&local_68,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_108);
    local_d8 = (state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108 = (state_x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
    dStack_100 = 1.48219693752374e-323;
    local_e8 = 3;
    local_f0 = state_x;
    if (local_d8 < 6) goto LAB_005de2a4;
    ChVector<double>::operator=
              (&local_a8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_108);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if ((ChVector<double> *)(lVar5 + 0x20) != &local_88) {
      local_88.m_data[0] = *(double *)(lVar5 + 0x20);
      local_88.m_data[1] = *(double *)(lVar5 + 0x28);
      local_88.m_data[2] = *(double *)(lVar5 + 0x30);
    }
    if ((ChVector<double> *)(lVar6 + 0x20) != &local_c8) {
      local_c8.m_data[0] = *(double *)(lVar6 + 0x20);
      local_c8.m_data[1] = *(double *)(lVar6 + 0x28);
      local_c8.m_data[2] = *(double *)(lVar6 + 0x30);
    }
  }
  else {
    local_108 = (state_w->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_d8 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    dStack_100 = 1.48219693752374e-323;
    local_e8 = 0;
    local_f0 = (ChState *)state_w;
    if (local_d8 < 3) goto LAB_005de2a4;
    ChVector<double>::operator=
              (&local_88,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_108);
    local_d8 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108 = (state_w->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
    dStack_100 = 1.48219693752374e-323;
    local_e8 = 3;
    local_f0 = (ChState *)state_w;
    if (local_d8 < 6) goto LAB_005de2a4;
    ChVector<double>::operator=
              (&local_c8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_108);
  }
  local_108 = (double *)(local_68.m_data[0] - local_a8.m_data[0]);
  dStack_100 = local_68.m_data[1] - local_a8.m_data[1];
  local_f8 = local_68.m_data[2] - local_a8.m_data[2];
  local_48 = local_88.m_data[0] - local_c8.m_data[0];
  dStack_40 = local_88.m_data[1] - local_c8.m_data[1];
  local_38 = local_88.m_data[2] - local_c8.m_data[2];
  pCVar1 = &this->computed_abs_force;
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_108,&local_48,pCVar1);
  if (2 < (this->super_ChLoadCustomMultiple).load_Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar7 = (this->super_ChLoadCustomMultiple).load_Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar8 = 3;
    if ((((ulong)pdVar7 & 7) == 0) &&
       (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
      uVar8 = uVar9;
    }
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        pdVar7[uVar9] = pCVar1->m_data[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (uVar8 < 3) {
      do {
        pdVar7[uVar8] = pCVar1->m_data[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
    }
    if (5 < (this->super_ChLoadCustomMultiple).load_Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar7 = (this->super_ChLoadCustomMultiple).load_Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
      uVar8 = 3;
      if ((((ulong)pdVar7 & 7) == 0) &&
         (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
        uVar8 = uVar9;
      }
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          auVar10._0_8_ = -pCVar1->m_data[uVar9];
          auVar10._8_8_ = 0x8000000000000000;
          dVar2 = (double)vmovlpd_avx(auVar10);
          pdVar7[uVar9] = dVar2;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      if (uVar8 < 3) {
        do {
          auVar11._0_8_ = -pCVar1->m_data[uVar8];
          auVar11._8_8_ = 0x8000000000000000;
          dVar2 = (double)vmovlpd_avx(auVar11);
          pdVar7[uVar8] = dVar2;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return;
    }
  }
LAB_005de2a4:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadXYZnodeXYZnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {

	auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
	auto mnodeB = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[1]);

	ChVector<> nodeApos;
	ChVector<> nodeApos_dt;
	ChVector<> nodeBpos;
	ChVector<> nodeBpos_dt;

	if (state_x) {
        // the numerical jacobian algo might change state_x
        nodeApos = state_x->segment(0, 3);
		nodeBpos = state_x->segment(3, 3);
    } else {
		nodeApos = mnodeA->GetPos();
		nodeBpos = mnodeB->GetPos();
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
		nodeApos_dt = state_w->segment(0, 3);
		nodeBpos_dt = state_w->segment(3, 3);
    } else {
        nodeApos_dt = mnodeA->GetPos_dt();
		nodeBpos_dt = mnodeB->GetPos_dt();
    }

	ComputeForce((nodeApos-nodeBpos), (nodeApos_dt-nodeBpos_dt), computed_abs_force);

    // Compute Q 
    load_Q.segment(0, 3) = computed_abs_force.eigen();
    load_Q.segment(3, 3) = -computed_abs_force.eigen();
}